

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoopThread.cpp
# Opt level: O0

void __thiscall EventLoopThread::EventLoopThread(EventLoopThread *this)

{
  Condition *in_RDI;
  MutexLock *_mutex;
  _Bind<void_(EventLoopThread::*(EventLoopThread_*))()> *__f;
  function<void_()> *this_00;
  string *in_stack_ffffffffffffff80;
  ThreadFunc *in_stack_ffffffffffffff88;
  Thread *in_stack_ffffffffffffff90;
  function<void_()> local_40 [2];
  
  ((_Alloc_hider *)&in_RDI->mutex)->_M_p = (pointer)0x0;
  (in_RDI->cond).__size[0] = '\0';
  __f = (_Bind<void_(EventLoopThread::*(EventLoopThread_*))()> *)((in_RDI->cond).__size + 8);
  this_00 = local_40;
  std::bind<void(EventLoopThread::*)(),EventLoopThread*>
            ((offset_in_EventLoopThread_to_subr *)__f,(EventLoopThread **)in_RDI);
  std::function<void()>::function<std::_Bind<void(EventLoopThread::*(EventLoopThread*))()>,void>
            (this_00,__f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffff90,(char *)in_stack_ffffffffffffff88,
             (allocator<char> *)in_stack_ffffffffffffff80);
  Thread::Thread(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff87);
  std::function<void_()>::~function((function<void_()> *)0x10bbc9);
  _mutex = (MutexLock *)((long)&in_RDI[3].cond + 0x28);
  MutexLock::MutexLock((MutexLock *)0x10bbde);
  Condition::Condition(in_RDI,_mutex);
  return;
}

Assistant:

EventLoopThread::EventLoopThread()
        : loop_(nullptr),
        exiting_(false),
        thread_(bind(&EventLoopThread::threadFunc, this), "EventLoopThread"),
        mutex_(),
        cond_(mutex_) {  }